

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.cpp
# Opt level: O2

void * RazorAHRSThread(void *pParam)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  interval *piVar9;
  ulong uVar10;
  long lVar11;
  double local_a18;
  double local_a10;
  interval local_a08;
  int local_9f0;
  int local_9ec;
  interval local_9e8;
  interval local_9d0;
  timeval local_9b8;
  RAZORAHRSDATA razorahrsdata;
  CHRONO chrono_period;
  char szTemp [256];
  RAZORAHRS razorahrs;
  char szSaveFilePath [256];
  
  memset(&razorahrs,0,0x6c0);
  local_9b8.tv_sec = 0;
  local_9b8.tv_usec = 0;
  razorahrsdata.yaw = 0.0;
  razorahrsdata.pitch = 0.0;
  razorahrsdata.roll = 0.0;
  razorahrsdata.accx = 0.0;
  razorahrsdata.accy = 0.0;
  razorahrsdata.accz = 0.0;
  razorahrsdata.gyrx = 0.0;
  razorahrsdata.gyry = 0.0;
  razorahrsdata.gyrz = 0.0;
  razorahrsdata.Roll = 0.0;
  razorahrsdata.Pitch = 0.0;
  razorahrsdata.Yaw = 0.0;
  StartChrono(&chrono_period);
  bVar3 = false;
  local_9f0 = 0;
  iVar6 = 0x32;
  do {
    local_9ec = iVar6;
    lVar11 = (long)local_9ec;
    bVar3 = !bVar3;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      mSleep(lVar11);
      if (bPauseRazorAHRS == 0) break;
      if (!bVar3) {
        puts("RazorAHRS paused.");
        DisconnectRazorAHRS(&razorahrs);
      }
      if (bExit != 0) goto LAB_0013c783;
      mSleep(100);
      bVar3 = true;
    }
    if (bRestartRazorAHRS == 0) {
      if (bVar3) goto LAB_0013c0e6;
      iVar6 = GetLatestDataRazorAHRS(&razorahrs,&razorahrsdata);
      if (iVar6 == 0) {
        iVar5 = gettimeofday(&local_9b8,(__timezone_ptr_t)0x0);
        iVar6 = local_9ec;
        if (iVar5 != 0) {
          local_9b8.tv_sec = 0;
          local_9b8.tv_usec = 0;
        }
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        local_a18 = fmod_2PI(razorahrsdata.Roll);
        interval::interval(&local_9d0,&local_a18);
        local_a10 = -phi_ahrs_acc;
        interval::interval(&local_a08,&local_a10,&phi_ahrs_acc);
        operator+(&local_9d0,&local_a08);
        interval::operator=((interval *)&phi_ahrs,&local_9e8);
        local_a18 = fmod_2PI(-razorahrsdata.Pitch);
        interval::interval(&local_9d0,&local_a18);
        local_a10 = -theta_ahrs_acc;
        interval::interval(&local_a08,&local_a10,&theta_ahrs_acc);
        operator+(&local_9d0,&local_a08);
        interval::operator=((interval *)&theta_ahrs,&local_9e8);
        local_a18 = fmod_2PI((1.5707963267948966 - razorahrsdata.Yaw) - angle_env);
        interval::interval(&local_9d0,&local_a18);
        local_a10 = -psi_ahrs_acc;
        interval::interval(&local_a08,&local_a10,&psi_ahrs_acc);
        operator+(&local_9d0,&local_a08);
        piVar9 = interval::operator=((interval *)&psi_ahrs,&local_9e8);
        if ((razorahrs.bROSMode != 0) &&
           ((((auVar2._4_4_ = -(uint)(razorahrsdata.gyry != 0.0),
              auVar2._0_4_ = -(uint)(razorahrsdata.gyrx != 0.0),
              auVar2._8_4_ = -(uint)(razorahrsdata.gyrz != 0.0),
              auVar2._12_4_ = -(uint)(razorahrsdata.accx != 0.0),
              iVar5 = movmskps((int)piVar9,auVar2), iVar5 != 0 || (razorahrsdata.accy != 0.0)) ||
             (NAN(razorahrsdata.accy))) ||
            ((razorahrsdata.accz != 0.0 || (NAN(razorahrsdata.accz))))))) {
          interval::interval(&local_9d0,&razorahrsdata.gyrx);
          local_a18 = -omegax_ahrs_acc;
          interval::interval(&local_a08,&local_a18,&omegax_ahrs_acc);
          operator+(&local_9d0,&local_a08);
          interval::operator=((interval *)&omegax_ahrs,&local_9e8);
          local_a18 = -razorahrsdata.gyry;
          interval::interval(&local_9d0,&local_a18);
          local_a10 = -omegay_ahrs_acc;
          interval::interval(&local_a08,&local_a10,&omegay_ahrs_acc);
          operator+(&local_9d0,&local_a08);
          interval::operator=((interval *)&omegay_ahrs,&local_9e8);
          local_a18 = -razorahrsdata.gyrz;
          interval::interval(&local_9d0,&local_a18);
          local_a10 = -omegaz_ahrs_acc;
          interval::interval(&local_a08,&local_a10,&omegaz_ahrs_acc);
          operator+(&local_9d0,&local_a08);
          interval::operator=((interval *)&omegaz_ahrs,&local_9e8);
          local_a18 = razorahrsdata.accx * 9.8 * 0.00390625;
          interval::interval(&local_9d0,&local_a18);
          local_a10 = -accrx_ahrs_acc;
          interval::interval(&local_a08,&local_a10,&accrx_ahrs_acc);
          operator+(&local_9d0,&local_a08);
          interval::operator=((interval *)&accrx_ahrs,&local_9e8);
          local_a18 = razorahrsdata.accy * -9.8 * 0.00390625;
          interval::interval(&local_9d0,&local_a18);
          local_a10 = -accry_ahrs_acc;
          interval::interval(&local_a08,&local_a10,&accry_ahrs_acc);
          operator+(&local_9d0,&local_a08);
          interval::operator=((interval *)&accry_ahrs,&local_9e8);
          local_a18 = razorahrsdata.accz * -9.8 * 0.00390625;
          interval::interval(&local_9d0,&local_a18);
          local_a10 = -accrz_ahrs_acc;
          interval::interval(&local_a08,&local_a10,&accrz_ahrs_acc);
          operator+(&local_9d0,&local_a08);
          interval::operator=((interval *)&accrz_ahrs,&local_9e8);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_0013c76a;
      }
      puts("Connection to a RazorAHRS lost.");
      DisconnectRazorAHRS(&razorahrs);
LAB_0013c103:
      local_9f0 = local_9f0 + 1;
      if (ExitOnErrorCount <= local_9f0 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_0013c783:
        bVar4 = true;
        goto LAB_0013c786;
      }
      bVar3 = false;
      bVar4 = true;
      iVar6 = local_9ec;
    }
    else {
      if (!bVar3) {
        puts("Restarting a RazorAHRS.");
        DisconnectRazorAHRS(&razorahrs);
      }
      bRestartRazorAHRS = 0;
LAB_0013c0e6:
      iVar5 = ConnectRazorAHRS(&razorahrs,"RazorAHRS0.txt");
      iVar6 = razorahrs.threadperiod;
      if (iVar5 != 0) {
        mSleep(1000);
        goto LAB_0013c103;
      }
      local_9b8.tv_sec = 0;
      local_9b8.tv_usec = 0;
      razorahrsdata.yaw = 0.0;
      razorahrsdata.pitch = 0.0;
      razorahrsdata.roll = 0.0;
      razorahrsdata.accx = 0.0;
      razorahrsdata.accy = 0.0;
      razorahrsdata.accz = 0.0;
      razorahrsdata.gyrx = 0.0;
      razorahrsdata.gyry = 0.0;
      razorahrsdata.gyrz = 0.0;
      razorahrsdata.Roll = 0.0;
      razorahrsdata.Pitch = 0.0;
      razorahrsdata.Yaw = 0.0;
      if (razorahrs.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)razorahrs.pfSaveFile);
        razorahrs.pfSaveFile = (FILE *)0x0;
      }
      if (razorahrs.bSaveRawData == 0) {
LAB_0013c76a:
        bVar4 = false;
        bVar3 = true;
      }
      else {
        if (razorahrs.szCfgFilePath[0] == '\0') {
          builtin_strncpy(szTemp,"razorahrs",10);
        }
        else {
          sprintf(szTemp,"%.127s",razorahrs.szCfgFilePath);
        }
        sVar7 = strlen(szTemp);
        iVar5 = (int)sVar7 + 1;
        uVar10 = sVar7 & 0xffffffff;
        do {
          if ((int)uVar10 < 1) goto LAB_0013c269;
          uVar1 = uVar10 - 1;
          iVar5 = iVar5 + -1;
          lVar11 = uVar10 - 1;
          uVar10 = uVar1;
        } while (szTemp[lVar11] != '.');
        if ((uVar1 != 0) && (iVar5 <= (int)sVar7)) {
          memset(szTemp + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
        }
LAB_0013c269:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar8 = strtimeex_fns();
        bVar4 = false;
        sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar8);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        razorahrs.pfSaveFile = (FILE *)fopen(szSaveFilePath,"w");
        bVar3 = true;
        if ((FILE *)razorahrs.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create RazorAHRS data file.");
          bVar4 = false;
          goto LAB_0013c786;
        }
      }
    }
    if (bExit != 0) {
LAB_0013c786:
      StopChronoQuick(&chrono_period);
      if (razorahrs.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)razorahrs.pfSaveFile);
        razorahrs.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar4) {
        DisconnectRazorAHRS(&razorahrs);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE RazorAHRSThread(void* pParam)
{
	RAZORAHRS razorahrs;
	struct timeval tv;
	RAZORAHRSDATA razorahrsdata;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&razorahrs, 0, sizeof(RAZORAHRS));

	memset(&tv, 0, sizeof(tv));
	memset(&razorahrsdata, 0, sizeof(razorahrsdata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseRazorAHRS) 
		{ 
			if (bConnected)
			{
				printf("RazorAHRS paused.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartRazorAHRS) 
		{ 
			if (bConnected)
			{
				printf("Restarting a RazorAHRS.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
			bRestartRazorAHRS = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectRazorAHRS(&razorahrs, "RazorAHRS0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = razorahrs.threadperiod;

				memset(&tv, 0, sizeof(tv));
				memset(&razorahrsdata, 0, sizeof(razorahrsdata));

				if (razorahrs.pfSaveFile != NULL)
				{
					fclose(razorahrs.pfSaveFile); 
					razorahrs.pfSaveFile = NULL;
				}
				if ((razorahrs.bSaveRawData)&&(razorahrs.pfSaveFile == NULL)) 
				{
					if (strlen(razorahrs.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", razorahrs.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "razorahrs");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					razorahrs.pfSaveFile = fopen(szSaveFilePath, "w");
					if (razorahrs.pfSaveFile == NULL) 
					{
						printf("Unable to create RazorAHRS data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataRazorAHRS(&razorahrs, &razorahrsdata) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);

				phi_ahrs = fmod_2PI(razorahrsdata.Roll)+interval(-phi_ahrs_acc, phi_ahrs_acc);
				theta_ahrs = fmod_2PI(-razorahrsdata.Pitch)+interval(-theta_ahrs_acc, theta_ahrs_acc);
				psi_ahrs = fmod_2PI(M_PI/2.0-razorahrsdata.Yaw-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);

				if ((razorahrs.bROSMode)&&
					!((razorahrsdata.gyrx == 0)&&(razorahrsdata.gyry == 0)&&(razorahrsdata.gyrz == 0)&&
					(razorahrsdata.accx == 0)&&(razorahrsdata.accy == 0)&&(razorahrsdata.accz == 0)))
				{
					omegax_ahrs = razorahrsdata.gyrx+interval(-omegax_ahrs_acc, omegax_ahrs_acc);
					omegay_ahrs = -razorahrsdata.gyry+interval(-omegay_ahrs_acc, omegay_ahrs_acc);
					omegaz_ahrs = -razorahrsdata.gyrz+interval(-omegaz_ahrs_acc, omegaz_ahrs_acc);
					accrx_ahrs = razorahrsdata.accx*9.8/256.0+interval(-accrx_ahrs_acc, accrx_ahrs_acc);
					accry_ahrs = -razorahrsdata.accy*9.8/256.0+interval(-accry_ahrs_acc, accry_ahrs_acc);
					accrz_ahrs = -razorahrsdata.accz*9.8/256.0+interval(-accrz_ahrs_acc, accrz_ahrs_acc);
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a RazorAHRS lost.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
		}

		//printf("RazorAHRSThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (razorahrs.pfSaveFile != NULL)
	{
		fclose(razorahrs.pfSaveFile); 
		razorahrs.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectRazorAHRS(&razorahrs);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}